

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::TestQuoteMeta(string *unquoted,Options *options)

{
  bool bVar1;
  ostream *poVar2;
  StringPiece *in_RDX;
  string quoted;
  RE2 re;
  string local_2a0;
  LogMessage local_280;
  RE2 local_100;
  
  local_280._0_8_ = (unquoted->_M_dataplus)._M_p;
  local_280._8_4_ = SUB84(unquoted->_M_string_length,0);
  RE2::QuoteMeta_abi_cxx11_(&local_2a0,(RE2 *)&local_280,in_RDX);
  local_280._0_8_ = local_2a0._M_dataplus._M_p;
  local_280._8_4_ = (int)local_2a0._M_string_length;
  RE2::RE2(&local_100,(StringPiece *)&local_280,options);
  local_280._0_8_ = (unquoted->_M_dataplus)._M_p;
  local_280._8_4_ = SUB84(unquoted->_M_string_length,0);
  bVar1 = RE2::FullMatchN((StringPiece *)&local_280,&local_100,(Arg **)0x0,0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x185,3);
    poVar2 = (ostream *)((long)&local_280 + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Check failed: RE2::FullMatch(unquoted, re)",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Unquoted=\'",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(unquoted->_M_dataplus)._M_p,unquoted->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\', quoted=\'",0xb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_2a0._M_dataplus._M_p,
                        CONCAT44(local_2a0._M_string_length._4_4_,(int)local_2a0._M_string_length));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'.",2);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_280);
  }
  RE2::~RE2(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void TestQuoteMeta(string unquoted,
                          const RE2::Options& options = RE2::DefaultOptions) {
  string quoted = RE2::QuoteMeta(unquoted);
  RE2 re(quoted, options);
  EXPECT_TRUE(RE2::FullMatch(unquoted, re))
      << "Unquoted='" << unquoted << "', quoted='" << quoted << "'.";
}